

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
::
find<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Entry,capnp::StructSchema&>
          (HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
           *this,ArrayPtr<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
                 table,StructSchema *params)

{
  AnnotatedHandler *pAVar1;
  bool bVar2;
  uint uVar3;
  Disposer *pDVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  ulong uVar6;
  uint hash;
  Entry *pEVar7;
  int iVar8;
  uint64_t *in_R8;
  Disposer *pDVar9;
  Maybe<unsigned_long> MVar10;
  Type local_40;
  
  pEVar7 = table.ptr;
  pAVar1 = (pEVar7->value).ptr.ptr;
  aVar5.value = table.size_;
  if (pAVar1 != (AnnotatedHandler *)0x0) {
    hash = (uint)((int)(*in_R8 >> 0x20) * 0xbfe3 + (int)*in_R8 != 0);
    uVar3 = kj::_::chooseBucket(hash,(uint)pAVar1);
    uVar6 = (ulong)uVar3;
    pDVar4 = (pEVar7->value).ptr.disposer;
    iVar8 = *(int *)((long)&pDVar4[uVar6]._vptr_Disposer + 4);
    aVar5 = extraout_RDX;
    if (iVar8 != 0) {
      pDVar9 = pDVar4 + uVar6;
      do {
        if ((iVar8 != 1) && (*(uint *)&pDVar9->_vptr_Disposer == hash)) {
          local_40.field_4.scopeId = *in_R8;
          local_40.baseType = STRUCT;
          local_40.listDepth = '\0';
          bVar2 = capnp::Type::operator==
                            ((Type *)((ulong)(iVar8 - 2) * 0x20 + table.size_),&local_40);
          aVar5 = extraout_RDX_00;
          if (bVar2) {
            iVar8 = *(int *)((long)&pDVar9->_vptr_Disposer + 4);
            *this = (HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
                     )0x1;
            *(ulong *)(this + 8) = (ulong)(iVar8 - 2);
            goto LAB_001f313d;
          }
          pDVar4 = (pEVar7->value).ptr.disposer;
        }
        if ((AnnotatedHandler *)(uVar6 + 1) == (pEVar7->value).ptr.ptr) {
          uVar6 = 0;
        }
        else {
          uVar6 = uVar6 + 1 & 0xffffffff;
        }
        pDVar9 = pDVar4 + uVar6;
        iVar8 = *(int *)((long)&pDVar9->_vptr_Disposer + 4);
      } while (iVar8 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::Type,kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>>>::Callbacks>
           )0x0;
LAB_001f313d:
  MVar10.ptr.field_1.value = aVar5.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }